

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMAddressingModes.h
# Opt level: O2

char * ARM_AM_getShiftOpcStr(ARM_AM_ShiftOpc Op)

{
  if (Op - ARM_AM_asr < 5) {
    return &DAT_001d2068 + *(int *)(&DAT_001d2068 + (ulong)(Op - ARM_AM_asr) * 4);
  }
  return anon_var_dwarf_e7b5e + 0x11;
}

Assistant:

static inline char *ARM_AM_getShiftOpcStr(ARM_AM_ShiftOpc Op)
{
	switch (Op) {
		default: return "";	//llvm_unreachable("Unknown shift opc!");
		case ARM_AM_asr: return "asr";
		case ARM_AM_lsl: return "lsl";
		case ARM_AM_lsr: return "lsr";
		case ARM_AM_ror: return "ror";
		case ARM_AM_rrx: return "rrx";
	}
}